

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O3

vm_val_t * CVmRun::get_fp_at_level(int level)

{
  vm_val_t *pvVar1;
  void *pvVar2;
  
  if (level == 0 || frame_ptr_ == (vm_val_t *)0x0) {
    if (frame_ptr_ != (vm_val_t *)0x0) {
      return frame_ptr_;
    }
  }
  else {
    pvVar2 = (void *)0x0;
    pvVar1 = frame_ptr_;
    do {
      if (((pvVar2 != (void *)0x0) && (*(long *)((long)pvVar2 + 0x40) != 0)) &&
         (level = level + -1, level == 0)) {
        return pvVar1;
      }
      pvVar2 = pvVar1[-5].val.ptr;
      pvVar1 = (vm_val_t *)pvVar1[-1].val.ptr;
    } while ((pvVar1 != (vm_val_t *)0x0) && (level = level + -1, level != 0));
    if ((pvVar1 != (vm_val_t *)0x0) &&
       ((pvVar2 == (void *)0x0 || (*(long *)((long)pvVar2 + 0x40) == 0)))) {
      return pvVar1;
    }
  }
  err_throw(0x9c4);
}

Assistant:

vm_val_t *CVmRun::get_fp_at_level(VMG_ int level) VM_REG_CONST
{
    vm_val_t *fp;
    const vm_rcdesc *rc;
    
    /* walk up the stack to the desired level */
    for (fp = frame_ptr_, rc = 0 ; fp != 0 && level != 0 ; --level)
    {
        /* if this is a recursive level, count it */
        if (rc != 0 && rc->has_return_addr())
        {
            /* move to the bytecode caller at this level */
            rc = 0;
            
            /* count the level */
            if (--level == 0)
                break;
        }

        /* move to the enclosing level */
        rc = get_rcdesc_from_frame(vmg_ fp);
        fp = get_enclosing_frame_ptr(vmg_ fp);
    }

    /* 
     *   if we ran out of frames before we reached the desired level, or we
     *   stopped at a native caller, the requested frame doesn't exist 
     */
    if (fp == 0 || (rc != 0 && rc->has_return_addr()))
        err_throw(VMERR_BAD_FRAME);

    /* return the frame */
    return fp;
}